

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void alterneigh(nn_quant *nnq,int rad,int i,int al,int b,int g,int r)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar7 = -1;
  if (-1 < i - rad) {
    iVar7 = i - rad;
  }
  iVar4 = rad + i;
  if (nnq->netsize <= rad + i) {
    iVar4 = nnq->netsize;
  }
  iVar13 = i + 1;
  iVar8 = i + -1;
  bVar2 = iVar13 < iVar4;
  bVar3 = iVar7 < iVar8;
  if (bVar2 || iVar7 < iVar8) {
    piVar9 = nnq->radpower;
    do {
      piVar9 = piVar9 + 1;
      iVar11 = *piVar9;
      if (bVar2) {
        iVar1 = nnq->network[iVar13][0];
        iVar12 = nnq->network[iVar13][1];
        iVar5 = (iVar1 - al) * iVar11;
        iVar10 = iVar5 + 0x3ffff;
        if (-1 < iVar5) {
          iVar10 = iVar5;
        }
        iVar6 = (iVar12 - b) * iVar11;
        iVar5 = iVar6 + 0x3ffff;
        if (-1 < iVar6) {
          iVar5 = iVar6;
        }
        nnq->network[iVar13][0] = iVar1 - (iVar10 >> 0x12);
        nnq->network[iVar13][1] = iVar12 - (iVar5 >> 0x12);
        iVar1 = nnq->network[iVar13][2];
        iVar10 = (iVar1 - g) * iVar11;
        iVar12 = iVar10 + 0x3ffff;
        if (-1 < iVar10) {
          iVar12 = iVar10;
        }
        nnq->network[iVar13][2] = iVar1 - (iVar12 >> 0x12);
        iVar1 = nnq->network[iVar13][3];
        iVar10 = (iVar1 - r) * iVar11;
        iVar12 = iVar10 + 0x3ffff;
        if (-1 < iVar10) {
          iVar12 = iVar10;
        }
        nnq->network[iVar13][3] = iVar1 - (iVar12 >> 0x12);
        iVar13 = iVar13 + 1;
      }
      if (bVar3) {
        iVar1 = nnq->network[iVar8][0];
        iVar12 = nnq->network[iVar8][1];
        iVar5 = (iVar1 - al) * iVar11;
        iVar10 = iVar5 + 0x3ffff;
        if (-1 < iVar5) {
          iVar10 = iVar5;
        }
        iVar6 = (iVar12 - b) * iVar11;
        iVar5 = iVar6 + 0x3ffff;
        if (-1 < iVar6) {
          iVar5 = iVar6;
        }
        nnq->network[iVar8][0] = iVar1 - (iVar10 >> 0x12);
        nnq->network[iVar8][1] = iVar12 - (iVar5 >> 0x12);
        iVar1 = nnq->network[iVar8][2];
        iVar10 = (iVar1 - g) * iVar11;
        iVar12 = iVar10 + 0x3ffff;
        if (-1 < iVar10) {
          iVar12 = iVar10;
        }
        nnq->network[iVar8][2] = iVar1 - (iVar12 >> 0x12);
        iVar1 = nnq->network[iVar8][3];
        iVar11 = (iVar1 - r) * iVar11;
        iVar12 = iVar11 + 0x3ffff;
        if (-1 < iVar11) {
          iVar12 = iVar11;
        }
        nnq->network[iVar8][3] = iVar1 - (iVar12 >> 0x12);
        iVar8 = iVar8 + -1;
      }
      bVar2 = iVar13 < iVar4;
      bVar3 = iVar7 < iVar8;
    } while (bVar2 || bVar3);
  }
  return;
}

Assistant:

void alterneigh(nnq, rad,i,al,b,g,r)
nn_quant *nnq;
int rad,i;
register int al,b,g,r;
{
	register int j,k,lo,hi,a;
	register int *p, *q;

	lo = i-rad;
	if (lo<-1) lo=-1;
	hi = i+rad;
	if (hi>nnq->netsize) hi=nnq->netsize;

	j = i+1;
	k = i-1;
	q = nnq->radpower;
	while ((j<hi) || (k>lo)) {
		a = (*(++q));
		if (j<hi) {
			p = nnq->network[j];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			j++;
		}
		if (k>lo) {
			p = nnq->network[k];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			k--;
		}
	}
}